

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte bVar2;
  char_t *pcVar3;
  byte *local_40;
  gap g;
  
  g.end = (char_t *)0x0;
  g.size = 0;
  do {
    while (bVar2 = *s, ((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
LAB_00123e5e:
      if (bVar2 == 0xd) {
        local_40 = (byte *)s + 1;
        *s = 10;
        pbVar1 = (byte *)s + 1;
        s = (char_t *)local_40;
        if (*pbVar1 == 10) {
          gap::push(&g,(char_t **)&local_40,1);
          s = (char_t *)local_40;
        }
      }
      else {
        local_40 = (byte *)s;
        if (bVar2 == 0x26) {
          s = strconv_escape(s,&g);
        }
        else {
          if (bVar2 == 0) {
            pcVar3 = gap::flush(&g,s);
            *pcVar3 = '\0';
            return (char_t *)(byte *)s;
          }
          if (bVar2 == 0x3c) {
            pcVar3 = gap::flush(&g,s);
            *pcVar3 = '\0';
            return (char_t *)((byte *)s + 1);
          }
          s = (char_t *)((byte *)s + 1);
        }
      }
    }
    bVar2 = ((byte *)s)[1];
    if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
      s = (char_t *)((byte *)s + 1);
      goto LAB_00123e5e;
    }
    bVar2 = ((byte *)s)[2];
    if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
      s = (char_t *)((byte *)s + 2);
      goto LAB_00123e5e;
    }
    bVar2 = ((byte *)s)[3];
    if (((anonymous_namespace)::chartype_table[bVar2] & 1) != 0) {
      s = (char_t *)((byte *)s + 3);
      goto LAB_00123e5e;
    }
    s = (char_t *)((byte *)s + 4);
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}